

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O1

avl_node * avl_next(avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  
  if (node != (avl_node *)0x0) {
    paVar2 = node->right;
    if (node->right != (avl_node *)0x0) {
      do {
        paVar1 = paVar2;
        paVar2 = paVar1->left;
      } while (paVar2 != (avl_node *)0x0);
      return paVar1;
    }
    paVar2 = node->parent;
    while (paVar1 = (avl_node *)((ulong)paVar2 & 0xfffffffffffffffc), paVar1 != (avl_node *)0x0) {
      if (paVar1->left == node) {
        return paVar1;
      }
      node = paVar1;
      paVar2 = paVar1->parent;
    }
  }
  return (avl_node *)0x0;
}

Assistant:

struct avl_node* avl_next(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->next;
#else

    struct avl_node *p;

    // smallest value of right subtree
    if (node->right) {
        p = node;
        node = node->right;
        while (node) {
            p = node;
            node = node->left;
        }
        return p;
    }

    // node does not have right child
    if (avl_parent(node)) {
        // find first parent that has right child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->left == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}